

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.c
# Opt level: O0

int dlmalloc_trim(size_t pad)

{
  int iVar1;
  int result;
  size_t pad_local;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  iVar1 = _gm_.mutex;
  if ((_gm_.mflags & 2) != 0) {
    LOCK();
    _gm_.mutex = 1;
    UNLOCK();
    if ((iVar1 != 0) && (iVar1 = spin_acquire_lock(&_gm_.mutex), iVar1 != 0)) {
      return 0;
    }
  }
  iVar1 = sys_trim(&_gm_,pad);
  if ((_gm_.mflags & 2) != 0) {
    _gm_.mutex = 0;
  }
  return iVar1;
}

Assistant:

int dlmalloc_trim(size_t pad) {
  int result = 0;
  ensure_initialization();
  if (!PREACTION(gm)) {
    result = sys_trim(gm, pad);
    POSTACTION(gm);
  }
  return result;
}